

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_flash_ff(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b0,ggml_tensor *b1,ggml_tensor *c0,
             ggml_tensor *c1)

{
  ggml_tensor *pgVar1;
  ggml_tensor *extraout_RAX;
  
  if (((b0->ne[0] == a->ne[0]) && (b0->ne[2] == a->ne[2])) && (b0->ne[3] == a->ne[3])) {
    if (((a->grad == (ggml_tensor *)0x0) && (b0->grad == (ggml_tensor *)0x0)) &&
       ((b1->grad == (ggml_tensor *)0x0 &&
        ((c0->grad == (ggml_tensor *)0x0 && (c1->grad == (ggml_tensor *)0x0)))))) {
      pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,a->ne,(void *)0x0);
      pgVar1->op = GGML_OP_FLASH_FF;
      pgVar1->grad = (ggml_tensor *)0x0;
      pgVar1->src0 = a;
      pgVar1->src1 = b0;
      pgVar1->opt[0] = b1;
      pgVar1->opt[1] = c0;
      pgVar1->opt[2] = c1;
      return pgVar1;
    }
    ggml_flash_ff_cold_2();
  }
  ggml_flash_ff_cold_1();
  a->is_param = true;
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar1 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,(void *)0x0);
    a->grad = pgVar1;
    return pgVar1;
  }
  ggml_set_param_cold_1();
  ggml_build_forward_impl((ggml_cgraph *)ctx,a,true);
  return extraout_RAX;
}

Assistant:

struct ggml_tensor * ggml_flash_ff(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b0,
        struct ggml_tensor  * b1,
        struct ggml_tensor  * c0,
        struct ggml_tensor  * c1) {
    GGML_ASSERT(ggml_can_mul_mat(b0, a));
    // TODO: more checks

    bool is_node = false;

    if (a->grad || b0->grad || b1->grad || c0->grad || c1->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    //struct ggml_tensor * result = ggml_dup_tensor(ctx, a);
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, a->ne);

    result->op   = GGML_OP_FLASH_FF;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b0;
    result->opt[0] = b1;
    result->opt[1] = c0;
    result->opt[2] = c1;

    return result;
}